

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_set_null(Curl_easy *data)

{
  Curl_creader *pCVar1;
  CURLcode CVar2;
  Curl_creader *r;
  Curl_creader *local_20;
  
  CVar2 = Curl_creader_create(&local_20,data,&cr_null,CURL_CR_CLIENT);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  pCVar1 = (data->req).reader_stack;
  while (pCVar1 != (Curl_creader *)0x0) {
    (data->req).reader_stack = pCVar1->next;
    (*pCVar1->crt->do_close)(data,pCVar1);
    (*Curl_cfree)(pCVar1);
    pCVar1 = (data->req).reader_stack;
  }
  CVar2 = do_init_reader_stack(data,local_20);
  return CVar2;
}

Assistant:

CURLcode Curl_creader_set_null(struct Curl_easy *data)
{
  struct Curl_creader *r;
  CURLcode result;

  result = Curl_creader_create(&r, data, &cr_null, CURL_CR_CLIENT);
  if(result)
    return result;

  cl_reset_reader(data);
  return do_init_reader_stack(data, r);
}